

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

shared_ptr<arangodb::velocypack::Builder> __thiscall
arangodb::velocypack::Parser::steal(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<arangodb::velocypack::Builder> sVar2;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  (this->_builder).super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)*in_RSI;
  (this->_builder).super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *in_RSI = 0;
    in_RSI[1] = 0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
      *in_RSI = 0;
      in_RSI[1] = 0;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00105d61;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      *in_RSI = 0;
      in_RSI[1] = 0;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    in_RDX._M_pi = extraout_RDX;
  }
LAB_00105d61:
  in_RSI[2] = 0;
  sVar2.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  sVar2.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<arangodb::velocypack::Builder>)
         sVar2.super___shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Builder> steal() {
    // Parser object is broken after a steal()
    std::shared_ptr<Builder> res(_builder);
    _builder.reset();
    _builderPtr = nullptr;
    return res;
  }